

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O0

int nextSwap(swapInfo *x)

{
  int iVar1;
  int local_20;
  int temp;
  int j;
  int i;
  swapInfo *x_local;
  
  temp = x->varN;
  while( true ) {
    if (temp < 2) {
      return 0;
    }
    if (x->realArray[x->posArray[temp].position + x->posArray[temp].direction] < temp) break;
    temp = temp + -1;
  }
  x->posArray[temp].position = x->posArray[temp].position + x->posArray[temp].direction;
  iVar1 = x->realArray[x->posArray[temp].position];
  x->realArray[x->posArray[temp].position] = temp;
  x->realArray[x->posArray[temp].position - x->posArray[temp].direction] = iVar1;
  x->posArray[iVar1].position = x->posArray[temp].position - x->posArray[temp].direction;
  for (local_20 = x->varN; temp < local_20; local_20 = local_20 + -1) {
    x->posArray[local_20].direction = -x->posArray[local_20].direction;
  }
  x->positionToSwap1 = x->posArray[iVar1].position + -1;
  x->positionToSwap2 = x->posArray[temp].position + -1;
  return 1;
}

Assistant:

int nextSwap(swapInfo* x)
{
	int i,j,temp;
	for(i=x->varN;i>1;i--)
	{
		if( i > x->realArray[x->posArray[i].position + x->posArray[i].direction] )
		{
			x->posArray[i].position = x->posArray[i].position + x->posArray[i].direction;
			temp = x->realArray[x->posArray[i].position];
			x->realArray[x->posArray[i].position] = i; 
			x->realArray[x->posArray[i].position - x->posArray[i].direction] = temp;
			x->posArray[temp].position = x->posArray[i].position - x->posArray[i].direction; 
			for(j=x->varN;j>i;j--)
			{
				x->posArray[j].direction = 	x->posArray[j].direction * -1;
			}
			x->positionToSwap1 = x->posArray[temp].position - 1;
			x->positionToSwap2 = x->posArray[i].position - 1;			
			return 1;
		}
		
	}
	return 0;	
}